

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall PSVIWriterHandlers::processActualValue(PSVIWriterHandlers *this,PSVIItem *item)

{
  int iVar1;
  undefined4 extraout_var;
  XMLCh *pXVar2;
  ArrayJanitor<char16_t> local_5b8 [8];
  ArrayJanitor<char16_t> jan_15;
  XMLCh *value_15;
  ArrayJanitor<char16_t> jan_14;
  XMLCh *value_14;
  ArrayJanitor<char16_t> jan_13;
  XMLCh *value_13;
  ArrayJanitor<char16_t> jan_12;
  XMLCh *value_12;
  ArrayJanitor<char16_t> jan_11;
  XMLCh *value_11;
  ArrayJanitor<char16_t> jan_10;
  XMLCh *value_10;
  ArrayJanitor<char16_t> jan_9;
  XMLCh *value_9;
  ArrayJanitor<char16_t> jan_8;
  XMLCh *value_8;
  ArrayJanitor<char16_t> jan_7;
  XMLCh *value_7;
  ArrayJanitor<char16_t> jan_6;
  XMLCh *value_6;
  ArrayJanitor<char16_t> jan_5;
  XMLCh *value_5;
  ArrayJanitor<char16_t> jan_4;
  XMLCh *value_4;
  ArrayJanitor<char16_t> jan_3;
  XMLCh *value_3;
  ArrayJanitor<char16_t> jan_2;
  XMLCh *value_2;
  ArrayJanitor<char16_t> jan_1;
  XMLCh *value_1;
  ArrayJanitor<char16_t> local_440 [8];
  ArrayJanitor<char16_t> jan;
  XMLCh *value;
  char buffer [1024];
  XSValue *obj;
  PSVIItem *item_local;
  PSVIWriterHandlers *this_local;
  XSValue *obj_00;
  
  if (item != (PSVIItem *)0x0) {
    iVar1 = (*item->_vptr_PSVIItem[4])();
    obj_00 = (XSValue *)CONCAT44(extraout_var,iVar1);
    if (obj_00 != (XSValue *)0x0) {
      writeString(this,L"<!--\n");
      incIndent(this);
      writeOpen(this,L"actualValue");
      incIndent(this);
      switch(*(undefined4 *)obj_00) {
      case 0:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
        break;
      case 1:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BOOLEAN);
        writeValue(this,L"dataValue",
                   (XMLCh *)(&xercesc_4_0::XMLUni::fgBooleanValueSpace +
                            (long)(int)(uint)(((byte)obj_00[8] & 1) == 0) * 2));
        break;
      case 2:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DECIMAL);
        sprintf((char *)&value,"%f",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)local_440);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor(local_440);
        break;
      case 3:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        sprintf((char *)&value,"%f",(double)*(float *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_2);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_2);
        break;
      case 4:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DOUBLE);
        sprintf((char *)&value,"%f",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_3);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_3);
        break;
      case 5:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DURATION);
        formDateTime(this,obj_00);
        break;
      case 6:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATETIME);
        formDateTime(this,obj_00);
        break;
      case 7:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_TIME);
        formDateTime(this,obj_00);
        break;
      case 8:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DATE);
        formDateTime(this,obj_00);
        break;
      case 9:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEARMONTH);
        formDateTime(this,obj_00);
        break;
      case 10:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_YEAR);
        formDateTime(this,obj_00);
        break;
      case 0xb:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTHDAY);
        formDateTime(this,obj_00);
        break;
      case 0xc:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_DAY);
        formDateTime(this,obj_00);
        break;
      case 0xd:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        formDateTime(this,obj_00);
        break;
      case 0xe:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_HEXBINARY);
        writeValue(this,L"dataValue",*(XMLCh **)(obj_00 + 8));
        break;
      case 0xf:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        writeValue(this,L"dataValue",*(XMLCh **)(obj_00 + 8));
        break;
      case 0x1f:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INTEGER);
        sprintf((char *)&value,"%ld",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_4);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_4);
        break;
      case 0x20:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
        sprintf((char *)&value,"%ld",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_5);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_5);
        break;
      case 0x21:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NEGATIVEINTEGER);
        sprintf((char *)&value,"%ld",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_6);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_6);
        break;
      case 0x22:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_LONG);
        sprintf((char *)&value,"%ld",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_7);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_7);
        break;
      case 0x23:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_INT);
        sprintf((char *)&value,"%d",(ulong)*(uint *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_8);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_8);
        break;
      case 0x24:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_SHORT);
        sprintf((char *)&value,"%d",(ulong)(uint)(int)*(short *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_9);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_9);
        break;
      case 0x25:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BYTE);
        sprintf((char *)&value,"%d",(ulong)(uint)(int)(char)obj_00[8]);
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_10);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_10);
        break;
      case 0x26:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
        sprintf((char *)&value,"%ld",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_11);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_11);
        break;
      case 0x27:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_ULONG);
        sprintf((char *)&value,"%lu",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_12);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_12);
        break;
      case 0x28:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UINT);
        sprintf((char *)&value,"%u",(ulong)*(uint *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_13);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_13);
        break;
      case 0x29:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_USHORT);
        sprintf((char *)&value,"%u",(ulong)*(ushort *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_14);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_14);
        break;
      case 0x2a:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_UBYTE);
        sprintf((char *)&value,"%u",(ulong)(byte)obj_00[8]);
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)&value_15);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)&value_15);
        break;
      case 0x2b:
        writeValue(this,L"dataType",(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_POSITIVEINTEGER);
        sprintf((char *)&value,"%ld",*(undefined8 *)(obj_00 + 8));
        pXVar2 = (XMLCh *)xercesc_4_0::XMLString::transcode
                                    ((char *)&value,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        xercesc_4_0::ArrayJanitor<char16_t>::ArrayJanitor((wchar16 *)local_5b8);
        writeValue(this,L"dataValue",pXVar2);
        xercesc_4_0::ArrayJanitor<char16_t>::~ArrayJanitor(local_5b8);
      }
      decIndent(this);
      writeClose(this,L"actualValue");
      decIndent(this);
      pXVar2 = L"-->\n";
      writeString(this,L"-->\n");
      if (obj_00 != (XSValue *)0x0) {
        xercesc_4_0::XSValue::~XSValue(obj_00);
        xercesc_4_0::XMemory::operator_delete((XMemory *)obj_00,pXVar2);
      }
    }
  }
  return;
}

Assistant:

void  PSVIWriterHandlers::processActualValue(PSVIItem* item)
{
    if (!item) return;

    XSValue* obj = item->getActualValue();

    if (obj)
    {
        char buffer[1024];

        writeString(gCommentStart);
        incIndent();
        writeOpen(gActualValue);
        incIndent();

        switch (obj->fData.f_datatype)
        {
        case XSValue::dt_boolean:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_BOOLEAN);
                writeValue(gDataValue, XMLUni::fgBooleanValueSpace[obj->fData.fValue.f_bool? 0: 1]);
            }
            break;
        case XSValue::dt_decimal:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DECIMAL);
                sprintf( buffer,"%f", obj->fData.fValue.f_decimal.f_dvalue);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_float:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_FLOAT);
                sprintf( buffer,"%f", obj->fData.fValue.f_float);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_double:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DOUBLE);
                sprintf( buffer,"%f", obj->fData.fValue.f_double);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_duration:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DURATION);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_dateTime:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DATETIME);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_time:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_TIME);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_date:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DATE);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gYearMonth:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_YEARMONTH);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gYear:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_YEAR);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gMonthDay:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_MONTHDAY);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gDay:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_DAY);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_gMonth:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_MONTH);
                formDateTime(obj);
            }
            break;
        case XSValue::dt_hexBinary:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_HEXBINARY);
                writeValue(gDataValue, obj->fData.fValue.f_strVal);
            }
            break;
        case XSValue::dt_base64Binary:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_BASE64BINARY);
                writeValue(gDataValue, obj->fData.fValue.f_strVal);
            }
            break;

        case XSValue::dt_integer:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_INTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_nonPositiveInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_NONPOSITIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_negativeInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_NEGATIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_long:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_LONG);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_int:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_INT);
                sprintf( buffer,"%d", obj->fData.fValue.f_int);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_short:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_SHORT);
                sprintf( buffer,"%d", obj->fData.fValue.f_short);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_byte:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_BYTE);
                sprintf( buffer,"%d", obj->fData.fValue.f_char);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_nonNegativeInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_NONNEGATIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedLong:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_ULONG);
                sprintf( buffer,"%lu", obj->fData.fValue.f_ulong);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedInt:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_UINT);
                sprintf( buffer,"%u", obj->fData.fValue.f_uint);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedShort:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_USHORT);
                sprintf( buffer,"%u", obj->fData.fValue.f_ushort);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_unsignedByte:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_UBYTE);
                sprintf( buffer,"%u", obj->fData.fValue.f_uchar);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_positiveInteger:
            {
                writeValue(gDataType, SchemaSymbols::fgDT_POSITIVEINTEGER);
                sprintf( buffer,"%ld", obj->fData.fValue.f_long);
                XMLCh *value = XMLString::transcode(buffer);
                ArrayJanitor<XMLCh> jan(value);
                writeValue(gDataValue, value);
            }
            break;
        case XSValue::dt_string:
        case XSValue::dt_anyURI:
        case XSValue::dt_QName:
        case XSValue::dt_NOTATION:
        case XSValue::dt_normalizedString:
        case XSValue::dt_token:
        case XSValue::dt_language:
        case XSValue::dt_NMTOKEN:
        case XSValue::dt_NMTOKENS:
        case XSValue::dt_Name:
        case XSValue::dt_NCName:
        case XSValue::dt_ID:
        case XSValue::dt_IDREF:
        case XSValue::dt_IDREFS:
        case XSValue::dt_ENTITY:
        case XSValue::dt_ENTITIES:
            break; //we shouldn't see them
        default:
            break;
        }

        decIndent();
        writeClose(gActualValue);
        decIndent();
        writeString(gCommentEnd);

    	delete obj;
 	}
}